

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::setFlagOption(Federate *this,int flag,bool flagValue)

{
  element_type *peVar1;
  
  if (flag != 0x6a) {
    if ((flag == 0) && ((char)(this->currentMode)._M_i < '\x01')) {
      this->observerMode = flagValue;
    }
    peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_Core[0x22])
              (peVar1,(ulong)(uint)(this->fedID).fid,(ulong)(uint)flag,flagValue,peVar1,
               peVar1->_vptr_Core[0x22]);
    return;
  }
  this->retriggerTimeRequest = flagValue;
  return;
}

Assistant:

void Federate::setFlagOption(int flag, bool flagValue)
{
    if (flag == defs::Flags::OBSERVER && currentMode < Modes::INITIALIZING) {
        observerMode = flagValue;
    }
    if (flag == defs::Flags::AUTOMATED_TIME_REQUEST) {
        retriggerTimeRequest = flagValue;
        return;
    }
    coreObject->setFlagOption(fedID, flag, flagValue);
}